

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldExtractUint::test
          (ShaderBitfieldOperationCaseBitfieldExtractUint *this,Data *data)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = this->m_components;
  uVar4 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  do {
    uVar3 = uVar2;
    if (uVar4 == uVar3) break;
    uVar5 = ~(-1 << ((byte)data->bits & 0x1f));
    if (data->bits == 0x20) {
      uVar5 = 0xffffffff;
    }
    uVar2 = uVar3 + 1;
  } while (data->outUvec4[uVar3] == (uVar5 & data->inUvec4[uVar3] >> ((byte)data->offset & 0x1f)));
  return (long)(int)uVar1 <= (long)uVar3;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected =
				(data->inUvec4[i] >> data->offset) & (data->bits == 32 ? 0xFFFFFFFF : ((1 << data->bits) - 1));
			if (data->outUvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}